

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

uint * ComputeMD5(uchar *data,int dataSize)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  void *__dest;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int offset;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  
  ComputeMD5::hash[0] = 0x67452301;
  ComputeMD5::hash[1] = 0xefcdab89;
  ComputeMD5::hash[2] = 0x98badcfe;
  ComputeMD5::hash[3] = 0x10325476;
  iVar3 = ((dataSize + 8) / 0x40) * 0x40;
  __dest = calloc((long)(iVar3 + 0x78),1);
  memcpy(__dest,data,(long)dataSize);
  *(undefined1 *)((long)__dest + (long)dataSize) = 0x80;
  *(int *)((long)__dest + (long)iVar3 + 0x38) = dataSize << 3;
  uVar5 = 0x67452301;
  uVar12 = 0xefcdab89;
  uVar18 = 0x98badcfe;
  uVar6 = 0x10325476;
  for (lVar14 = 0; lVar14 < (long)iVar3 + 0x38; lVar14 = lVar14 + 0x40) {
    lVar16 = 0;
    uVar8 = 1;
    uVar15 = 5;
    uVar19 = 0;
    uVar4 = uVar5;
    uVar11 = uVar12;
    uVar9 = uVar18;
    uVar2 = uVar6;
    for (uVar13 = 0; uVar17 = uVar9, uVar9 = uVar11, uVar13 != 0x40; uVar13 = uVar13 + 1) {
      if (uVar13 < 0x10) {
        uVar10 = (uVar17 ^ uVar2) & uVar9 ^ uVar2;
        uVar7 = uVar13;
      }
      else {
        if (uVar13 < 0x20) {
          uVar10 = (uVar9 ^ uVar17) & uVar2 ^ uVar17;
          uVar11 = uVar8;
        }
        else if (uVar13 < 0x30) {
          uVar10 = uVar17 ^ uVar9 ^ uVar2;
          uVar11 = uVar15;
        }
        else {
          uVar10 = (~uVar2 | uVar9) ^ uVar17;
          uVar11 = uVar19;
        }
        uVar7 = (ulong)(uVar11 & 0xf);
      }
      uVar11 = uVar10 + uVar4 + *(int *)((long)&DAT_00174f60 + lVar16) +
               *(int *)((long)__dest + uVar7 * 4 + lVar14);
      pbVar1 = &DAT_00174e60 + lVar16;
      uVar19 = uVar19 + 7;
      uVar15 = uVar15 + 3;
      uVar8 = uVar8 + 5;
      lVar16 = lVar16 + 4;
      uVar4 = uVar2;
      uVar11 = (uVar11 << (*pbVar1 & 0x1f) | uVar11 >> 0x20 - (*pbVar1 & 0x1f)) + uVar9;
      uVar2 = uVar17;
    }
    uVar5 = uVar5 + uVar4;
    uVar12 = uVar12 + uVar9;
    ComputeMD5::hash[1] = uVar12;
    ComputeMD5::hash[0] = uVar5;
    uVar18 = uVar18 + uVar17;
    uVar6 = uVar6 + uVar2;
    ComputeMD5::hash[3] = uVar6;
    ComputeMD5::hash[2] = uVar18;
  }
  free(__dest);
  return ComputeMD5::hash;
}

Assistant:

unsigned int *ComputeMD5(unsigned char *data, int dataSize)
{
    #define ROTATE_LEFT(x, c) (((x) << (c)) | ((x) >> (32 - (c))))

    static unsigned int hash[4] = { 0 };  // Hash to be returned

    // WARNING: All variables are unsigned 32 bit and wrap modulo 2^32 when calculating

    // NOTE: r specifies the per-round shift amounts
    unsigned int r[] = {
        7, 12, 17, 22, 7, 12, 17, 22, 7, 12, 17, 22, 7, 12, 17, 22,
        5,  9, 14, 20, 5,  9, 14, 20, 5,  9, 14, 20, 5,  9, 14, 20,
        4, 11, 16, 23, 4, 11, 16, 23, 4, 11, 16, 23, 4, 11, 16, 23,
        6, 10, 15, 21, 6, 10, 15, 21, 6, 10, 15, 21, 6, 10, 15, 21
    };

    // Using binary integer part of the sines of integers (in radians) as constants
    unsigned int k[] = {
        0xd76aa478, 0xe8c7b756, 0x242070db, 0xc1bdceee,
        0xf57c0faf, 0x4787c62a, 0xa8304613, 0xfd469501,
        0x698098d8, 0x8b44f7af, 0xffff5bb1, 0x895cd7be,
        0x6b901122, 0xfd987193, 0xa679438e, 0x49b40821,
        0xf61e2562, 0xc040b340, 0x265e5a51, 0xe9b6c7aa,
        0xd62f105d, 0x02441453, 0xd8a1e681, 0xe7d3fbc8,
        0x21e1cde6, 0xc33707d6, 0xf4d50d87, 0x455a14ed,
        0xa9e3e905, 0xfcefa3f8, 0x676f02d9, 0x8d2a4c8a,
        0xfffa3942, 0x8771f681, 0x6d9d6122, 0xfde5380c,
        0xa4beea44, 0x4bdecfa9, 0xf6bb4b60, 0xbebfbc70,
        0x289b7ec6, 0xeaa127fa, 0xd4ef3085, 0x04881d05,
        0xd9d4d039, 0xe6db99e5, 0x1fa27cf8, 0xc4ac5665,
        0xf4292244, 0x432aff97, 0xab9423a7, 0xfc93a039,
        0x655b59c3, 0x8f0ccc92, 0xffeff47d, 0x85845dd1,
        0x6fa87e4f, 0xfe2ce6e0, 0xa3014314, 0x4e0811a1,
        0xf7537e82, 0xbd3af235, 0x2ad7d2bb, 0xeb86d391
    };

    hash[0] = 0x67452301;
    hash[1] = 0xefcdab89;
    hash[2] = 0x98badcfe;
    hash[3] = 0x10325476;

    // Pre-processing: adding a single 1 bit
    // Append '1' bit to message
    // NOTE: The input bytes are considered as bits strings,
    // where the first bit is the most significant bit of the byte

    // Pre-processing: padding with zeros
    // Append '0' bit until message length in bit 448 (mod 512)
    // Append length mod (2 pow 64) to message

    int newDataSize = ((((dataSize + 8)/64) + 1)*64) - 8;

    unsigned char *msg = RL_CALLOC(newDataSize + 64, 1); // Initialize with '0' bits, allocating 64 extra bytes
    memcpy(msg, data, dataSize);
    msg[dataSize] = 128; // Write the '1' bit

    unsigned int bitsLen = 8*dataSize;
    memcpy(msg + newDataSize, &bitsLen, 4); // Append the len in bits at the end of the buffer

    // Process the message in successive 512-bit chunks for each 512-bit chunk of message
    for (int offset = 0; offset < newDataSize; offset += (512/8))
    {
        // Break chunk into sixteen 32-bit words w[j], 0 <= j <= 15
        unsigned int *w = (unsigned int *)(msg + offset);

        // Initialize hash value for this chunk
        unsigned int a = hash[0];
        unsigned int b = hash[1];
        unsigned int c = hash[2];
        unsigned int d = hash[3];

        for (int i = 0; i < 64; i++)
        {
            unsigned int f = 0;
            unsigned int g = 0;

            if (i < 16)
            {
                f = (b & c) | ((~b) & d);
                g = i;
            }
            else if (i < 32)
            {
                f = (d & b) | ((~d) & c);
                g = (5*i + 1)%16;
            }
            else if (i < 48)
            {
                f = b ^ c ^ d;
                g = (3*i + 5)%16;
            }
            else
            {
                f = c ^ (b | (~d));
                g = (7*i)%16;
            }

            unsigned int temp = d;
            d = c;
            c = b;
            b = b + ROTATE_LEFT((a + f + k[i] + w[g]), r[i]);
            a = temp;
        }

        // Add chunk's hash to result so far
        hash[0] += a;
        hash[1] += b;
        hash[2] += c;
        hash[3] += d;
    }

    RL_FREE(msg);

    return hash;
}